

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_slider.c
# Opt level: O0

void slider_dialog(t_slider *x,t_symbol *s,int argc,t_atom *argv)

{
  _glist *canvas;
  int iVar1;
  t_symbol *s_00;
  t_float tVar2;
  t_float tVar3;
  t_float tVar4;
  t_float tVar5;
  undefined1 local_198 [8];
  t_atom undo [18];
  int sr_flags;
  int steady;
  int lilo;
  double max;
  double min;
  int h;
  int w;
  t_symbol *srl [3];
  t_atom *argv_local;
  int argc_local;
  t_symbol *s_local;
  t_slider *x_local;
  
  tVar2 = atom_getfloatarg(0,argc,argv);
  min._4_4_ = (int)tVar2;
  tVar2 = atom_getfloatarg(1,argc,argv);
  min._0_4_ = (int)tVar2;
  tVar2 = atom_getfloatarg(2,argc,argv);
  tVar3 = atom_getfloatarg(3,argc,argv);
  tVar4 = atom_getfloatarg(4,argc,argv);
  tVar5 = atom_getfloatarg(0x11,argc,argv);
  if (x->x_orientation == horizontal) {
    min._4_4_ = ((x->x_gui).x_glist)->gl_zoom * min._4_4_;
  }
  else {
    min._0_4_ = ((x->x_gui).x_glist)->gl_zoom * min._0_4_;
  }
  iemgui_setdialogatoms(&x->x_gui,0x12,(t_atom *)local_198);
  undo[1].a_w.w_float = 1.4013e-45;
  undo[2].a_type = (t_atomtype)(float)x->x_min;
  undo[2].a_w.w_float = 1.4013e-45;
  undo[3].a_type = (t_atomtype)(float)x->x_max;
  undo[3].a_w.w_float = 1.4013e-45;
  undo[4].a_type = (t_atomtype)(float)x->x_lin0_log1;
  undo[0x10].a_w.w_float = 1.4013e-45;
  undo[0x11].a_type = (t_atomtype)(float)x->x_steady;
  canvas = (x->x_gui).x_glist;
  s_00 = gensym("dialog");
  pd_undo_set_objectstate(canvas,(t_pd *)x,s_00,0x12,(t_atom *)local_198,argc,argv);
  x->x_lin0_log1 = (uint)((int)tVar4 != 0);
  x->x_steady = (uint)((int)tVar5 != 0);
  iemgui_dialog(&x->x_gui,(t_symbol **)&h,argc,argv);
  if (x->x_orientation == horizontal) {
    iVar1 = iemgui_clip_size(min._0_4_);
    (x->x_gui).x_h = iVar1 * ((x->x_gui).x_glist)->gl_zoom;
    iVar1 = slider_check_range(x,min._4_4_);
    (x->x_gui).x_w = iVar1;
    slider_check_minmax(x,(double)tVar2,(double)tVar3,(float)(x->x_gui).x_w);
  }
  else {
    iVar1 = slider_check_range(x,min._0_4_);
    (x->x_gui).x_h = iVar1;
    iVar1 = iemgui_clip_size(min._4_4_);
    (x->x_gui).x_w = iVar1 * ((x->x_gui).x_glist)->gl_zoom;
    slider_check_minmax(x,(double)tVar2,(double)tVar3,(float)(x->x_gui).x_h);
  }
  iemgui_size(x,&x->x_gui);
  slider_set(x,x->x_fval);
  return;
}

Assistant:

static void slider_dialog(t_slider *x, t_symbol *s, int argc, t_atom *argv)
{
    t_symbol *srl[3];
    int w = (int)atom_getfloatarg(0, argc, argv);
    int h = (int)atom_getfloatarg(1, argc, argv);
    double min = (double)atom_getfloatarg(2, argc, argv);
    double max = (double)atom_getfloatarg(3, argc, argv);
    int lilo = (int)atom_getfloatarg(4, argc, argv);
    int steady = (int)atom_getfloatarg(17, argc, argv);
    int sr_flags;
    t_atom undo[18];

    if(x->x_orientation == horizontal)
        w *= IEMGUI_ZOOM(x);
    else
        h *= IEMGUI_ZOOM(x);

    iemgui_setdialogatoms(&x->x_gui, 18, undo);
    SETFLOAT(undo+2, x->x_min);
    SETFLOAT(undo+3, x->x_max);
    SETFLOAT(undo+4, x->x_lin0_log1);
    SETFLOAT(undo+17, x->x_steady);

    pd_undo_set_objectstate(x->x_gui.x_glist, (t_pd*)x, gensym("dialog"),
                            18, undo,
                            argc, argv);

    x->x_lin0_log1 = !!lilo;
    x->x_steady = !!steady;

    sr_flags = iemgui_dialog(&x->x_gui, srl, argc, argv);

    if(x->x_orientation == horizontal)
    {
        x->x_gui.x_h = iemgui_clip_size(h) * IEMGUI_ZOOM(x);
        x->x_gui.x_w = slider_check_range(x, w);
        slider_check_minmax(x, min, max, x->x_gui.x_w);
    } else {
        x->x_gui.x_h = slider_check_range(x, h);
        x->x_gui.x_w = iemgui_clip_size(w) * IEMGUI_ZOOM(x);
        slider_check_minmax(x, min, max, x->x_gui.x_h);
    }

    iemgui_size(x, &x->x_gui);
    slider_set(x, x->x_fval);
}